

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O1

void ScaleUVFilterCols64_C(uint8_t *dst_uv,uint8_t *src_uv,int dst_width,int x32,int dx)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  
  uVar2 = (ulong)x32;
  if (1 < dst_width) {
    iVar5 = 0;
    do {
      uVar4 = (uint)(uVar2 >> 9) & 0x7f;
      *(ushort *)dst_uv =
           (ushort)((*(ushort *)(src_uv + ((long)uVar2 >> 0x10) * 2 + 2) & 0xff) * uVar4 +
                    (*(ushort *)(src_uv + ((long)uVar2 >> 0x10) * 2) & 0xff) * (uVar4 ^ 0x7f) >> 7)
           | ((*(ushort *)(src_uv + ((long)uVar2 >> 0x10) * 2 + 2) >> 8) * (short)uVar4 +
             (*(ushort *)(src_uv + ((long)uVar2 >> 0x10) * 2) >> 8) * (short)(uVar4 ^ 0x7f)) * 2 &
             0xff00;
      lVar1 = uVar2 + (long)dx;
      lVar3 = lVar1 >> 0x10;
      uVar4 = (uint)(dx + (int)uVar2) >> 9 & 0x7f;
      *(ushort *)((long)dst_uv + 2) =
           (ushort)((*(ushort *)(src_uv + lVar3 * 2 + 2) & 0xff) * uVar4 +
                    (*(ushort *)(src_uv + lVar3 * 2) & 0xff) * (uVar4 ^ 0x7f) >> 7) |
           ((*(ushort *)(src_uv + lVar3 * 2 + 2) >> 8) * (short)uVar4 +
           (*(ushort *)(src_uv + lVar3 * 2) >> 8) * (short)(uVar4 ^ 0x7f)) * 2 & 0xff00;
      uVar2 = lVar1 + dx;
      dst_uv = (uint8_t *)((long)dst_uv + 4);
      iVar5 = iVar5 + 2;
    } while (iVar5 < dst_width + -1);
  }
  if ((dst_width & 1U) != 0) {
    uVar4 = (uint)(uVar2 >> 9) & 0x7f;
    *(ushort *)dst_uv =
         (ushort)((*(ushort *)(src_uv + ((long)uVar2 >> 0x10) * 2 + 2) & 0xff) * uVar4 +
                  (*(ushort *)(src_uv + ((long)uVar2 >> 0x10) * 2) & 0xff) * (uVar4 ^ 0x7f) >> 7) |
         ((*(ushort *)(src_uv + ((long)uVar2 >> 0x10) * 2 + 2) >> 8) * (short)uVar4 +
         (*(ushort *)(src_uv + ((long)uVar2 >> 0x10) * 2) >> 8) * (short)(uVar4 ^ 0x7f)) * 2 &
         0xff00;
  }
  return;
}

Assistant:

void ScaleUVFilterCols64_C(uint8_t* dst_uv,
                           const uint8_t* src_uv,
                           int dst_width,
                           int x32,
                           int dx) {
  int64_t x = (int64_t)(x32);
  const uint16_t* src = (const uint16_t*)(src_uv);
  uint16_t* dst = (uint16_t*)(dst_uv);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
    x += dx;
    xi = x >> 16;
    xf = (x >> 9) & 0x7f;
    a = src[xi];
    b = src[xi + 1];
    dst[1] = BLENDER(a, b, xf);
    x += dx;
    dst += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int xf = (x >> 9) & 0x7f;
    uint16_t a = src[xi];
    uint16_t b = src[xi + 1];
    dst[0] = BLENDER(a, b, xf);
  }
}